

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall
cppforth::Forth::restoreInput
          (Forth *this,structSavedInput *save,bool emptyCurrentBuffer,bool restoreNextCommand)

{
  CAddr CVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  Cell CVar5;
  Cell i;
  int iVar6;
  
  if (-1 < save->SourceDashId_) {
    if (emptyCurrentBuffer) {
      pbVar3 = (save->inputBufferStrings_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (save->inputBufferStrings_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar2 = (save->inputBufferStrings_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (save->inputBufferStrings_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (this->inputBufferStrings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (save->inputBufferStrings_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (this->inputBufferStrings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (save->inputBufferStrings_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (this->inputBufferStrings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->inputBufferStrings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar3;
      (this->inputBufferStrings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
      (this->inputBufferStrings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar2;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->inputBufferStrings,&save->inputBufferStrings_);
    }
    this->inputBufferStringsCurrent = save->inputBufferStringsCurrent_;
    if (save->blk == 0) {
      setSourceBuffer(this);
    }
  }
  setSourceVariables(this,save->SourceBufferAddress_,save->SourceBufferSize_,
                     save->SourceBufferOffset_);
  this->sourceid = save->SourceDashId_;
  CVar1 = this->VarOffsetBlkAddress;
  CVar5 = save->blk;
  iVar6 = 0;
  do {
    dataSpaceSet(this,CVar1 + iVar6,(Char)CVar5);
    CVar5 = CVar5 >> 8;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 4);
  this->InterpretState = save->interpretState_;
  if (restoreNextCommand) {
    this->next_command = save->next_;
  }
  return;
}

Assistant:

void restoreInput(struct structSavedInput& save, bool emptyCurrentBuffer, bool restoreNextCommand) {
			if(save.SourceDashId_>=0 ){
				if (emptyCurrentBuffer) {
					std::swap(save.inputBufferStrings_, inputBufferStrings);
				}
				else {
					inputBufferStrings=save.inputBufferStrings_;
				}
				inputBufferStringsCurrent = save.inputBufferStringsCurrent_;
				// is restored from block (LOAD)
				if (save.blk == 0) {
					setSourceBuffer();
				}
			}
			setSourceVariables(save.SourceBufferAddress_, save.SourceBufferSize_, save.SourceBufferOffset_);
			setSourceId(save.SourceDashId_);
			setDataCell(VarOffsetBlkAddress, save.blk);
			InterpretState = save.interpretState_;
			// restoree next command for evaluate
			// do not need restore for RESTORE-INPUT
			if (restoreNextCommand) {
				next_command = save.next_;
			}
		}